

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ostringstream name;
  undefined1 auStack_198 [8];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar2 = getTypeName(this->colorType);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
  pcVar2 = FboTestUtil::getFormatName(this->colorFormat);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar3);
  }
  uVar1 = this->buffers;
  if ((uVar1 >> 8 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_depth",6);
    uVar1 = this->buffers;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_stencil",8);
    uVar1 = this->buffers;
  }
  if ((uVar1 & 0x500) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
    pcVar2 = getTypeName(this->depthStencilType);
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
    pcVar2 = FboTestUtil::getFormatName(this->depthStencilFormat);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar3);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::ostringstream name;

	DE_ASSERT(buffers & GL_COLOR_BUFFER_BIT);
	name << getTypeName(colorType) << "_" << getFormatName(colorFormat);

	if (buffers & GL_DEPTH_BUFFER_BIT)
		name << "_depth";
	if (buffers & GL_STENCIL_BUFFER_BIT)
		name << "_stencil";

	if (buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
		name << "_" << getTypeName(depthStencilType) << "_" << getFormatName(depthStencilFormat);

	return name.str();
}